

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O0

void __thiscall
SequenceDistanceGraph::load_from_gfa2(SequenceDistanceGraph *this,ifstream *gfaf,ifstream *fastaf)

{
  long lVar1;
  Support support;
  Support support_00;
  byte bVar2;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  logic_error *this_00;
  ulong uVar6;
  size_type sVar7;
  istream *piVar8;
  char *pcVar9;
  sgNodeID_t sVar10;
  mapped_type *pmVar11;
  istream *in_RDX;
  istream *in_RSI;
  long in_RDI;
  istringstream iss;
  uint64_t dist_egt0;
  uint64_t lcount;
  int32_t dist;
  sgNodeID_t dest_id;
  sgNodeID_t src_id;
  uint dest_end;
  uint dest_beg;
  uint source_end;
  uint source_beg;
  string id;
  string gfa_length;
  string gfa_star;
  string gfa_cigar;
  string gfa_destdir;
  string gfa_dest;
  string gfa_sourcedir;
  string gfa_source;
  string gfa_rtype;
  int i;
  uint64_t rcnodes;
  sgNodeID_t nextid;
  string seq;
  string name;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  gap_dist;
  string line;
  Node *in_stack_fffffffffffff708;
  SequenceDistanceGraph *in_stack_fffffffffffff710;
  string *in_stack_fffffffffffff718;
  Node *in_stack_fffffffffffff720;
  Node *in_stack_fffffffffffff728;
  Node *in_stack_fffffffffffff730;
  void *in_stack_fffffffffffff738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff750;
  char *in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff764;
  undefined4 in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff76c;
  undefined4 in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff774;
  mapped_type in_stack_fffffffffffff778;
  mapped_type in_stack_fffffffffffff780;
  Node *in_stack_fffffffffffff790;
  byte local_7aa;
  Support local_6b0;
  allocator local_699;
  string local_698 [88];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_640;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_638;
  allocator local_629;
  string local_628 [88];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_5d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_5c8;
  Support local_5c0;
  allocator local_5a9;
  string local_5a8 [88];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_550;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_548;
  allocator local_539;
  string local_538 [88];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_4e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_4d8;
  istringstream local_4d0 [384];
  ulong local_350;
  ulong local_348;
  int local_33c;
  mapped_type local_338;
  mapped_type local_330;
  uint local_328;
  uint local_324;
  uint local_320;
  uint local_31c;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [36];
  int local_1f4;
  undefined1 local_1b1;
  string local_190 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_170;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_168;
  ulong local_160;
  undefined8 local_158;
  allocator local_149;
  string local_148 [95];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [104];
  string local_38 [32];
  istream *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  poVar4 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff738 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffff738 >> 0x18,0));
  poVar4 = std::operator<<(poVar4,"Graph fasta filename: ");
  poVar4 = std::operator<<(poVar4,(string *)(in_RDI + 0x78));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff738 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffff738 >> 0x18,0));
  poVar4 = std::operator<<(poVar4,"Loading sequences from ");
  poVar4 = std::operator<<(poVar4,(string *)(in_RDI + 0x78));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)0x3734b3);
  std::__cxx11::string::string(local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"",&local_c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::reserve((ulong)local_c0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           *)0x373528);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"",&local_e9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff710,&in_stack_fffffffffffff708->sequence);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::vector<Node,_std::allocator<Node>_>::clear((vector<Node,_std::allocator<Node>_> *)0x3735b3);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::clear((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           *)0x3735c4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"",&local_149);
  Node::Node(in_stack_fffffffffffff730,&in_stack_fffffffffffff728->sequence,
             (NodeStatus)((ulong)in_stack_fffffffffffff720 >> 0x38));
  add_node(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  Node::~Node((Node *)0x373637);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  local_158 = 1;
  local_160 = 0;
  do {
    while( true ) {
      bVar2 = std::ios::eof();
      if (((bVar2 ^ 0xff) & 1) == 0) {
        poVar4 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff738 >> 0x20),
                                   SUB81((ulong)in_stack_fffffffffffff738 >> 0x18,0));
        sVar7 = std::vector<Node,_std::allocator<Node>_>::size
                          ((vector<Node,_std::allocator<Node>_> *)(in_RDI + 0x40));
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar7 - 1);
        poVar4 = std::operator<<(poVar4," nodes loaded (");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_160);
        poVar4 = std::operator<<(poVar4," canonised).");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::string(local_218);
        std::__cxx11::string::string(local_238);
        std::__cxx11::string::string(local_258);
        std::__cxx11::string::string(local_278);
        std::__cxx11::string::string(local_298);
        std::__cxx11::string::string(local_2b8);
        std::__cxx11::string::string(local_2d8);
        std::__cxx11::string::string(local_2f8);
        std::__cxx11::string::string(local_318);
        local_348 = 0;
        local_350 = 0;
        while( true ) {
          piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_38)
          ;
          bVar3 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
          local_7aa = 0;
          if (bVar3) {
            local_7aa = std::ios::eof();
            local_7aa = local_7aa ^ 0xff;
          }
          if ((local_7aa & 1) == 0) break;
          std::__cxx11::istringstream::istringstream(local_4d0,local_38,_S_in);
          std::operator>>((istream *)local_4d0,local_218);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff710,(char *)in_stack_fffffffffffff708);
          if (bVar3) {
            std::operator>>((istream *)local_4d0,local_238);
            std::operator>>((istream *)local_4d0,local_2f8);
            std::operator>>((istream *)local_4d0,local_2d8);
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff710,(char *)in_stack_fffffffffffff708);
            if (bVar3) {
              std::operator>>((istream *)local_4d0,local_318);
              std::operator>>((istream *)local_4d0,local_238);
              std::operator>>((istream *)local_4d0,local_278);
              std::istream::operator>>((istream *)local_4d0,&local_31c);
              std::istream::operator>>((istream *)local_4d0,&local_320);
              std::istream::operator>>((istream *)local_4d0,&local_324);
              std::istream::operator>>((istream *)local_4d0,&local_328);
              std::operator>>((istream *)local_4d0,local_2b8);
              local_33c = local_31c - local_320;
              pcVar9 = (char *)std::__cxx11::string::back();
              std::__cxx11::string::operator=(local_258,*pcVar9);
              std::__cxx11::string::pop_back();
              pcVar9 = (char *)std::__cxx11::string::back();
              std::__cxx11::string::operator=(local_298,*pcVar9);
              std::__cxx11::string::pop_back();
              local_4d8._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)in_stack_fffffffffffff708,(key_type *)0x374082);
              local_4e0._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                          *)in_stack_fffffffffffff708);
              bVar3 = std::__detail::operator==(&local_4d8,&local_4e0);
              if (bVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_538,"",&local_539);
                Node::Node(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
                sVar10 = add_node(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
                pmVar11 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                          ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                        *)in_stack_fffffffffffff710,
                                       &in_stack_fffffffffffff708->sequence);
                *pmVar11 = sVar10;
                Node::~Node((Node *)0x374185);
                std::__cxx11::string::~string(local_538);
                std::allocator<char>::~allocator((allocator<char> *)&local_539);
              }
              local_548._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)in_stack_fffffffffffff708,(key_type *)0x374229);
              local_550._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                          *)in_stack_fffffffffffff708);
              bVar3 = std::__detail::operator==(&local_548,&local_550);
              if (bVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_5a8,"",&local_5a9);
                Node::Node(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
                sVar10 = add_node(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
                pmVar11 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                          ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                        *)in_stack_fffffffffffff710,
                                       &in_stack_fffffffffffff708->sequence);
                *pmVar11 = sVar10;
                Node::~Node((Node *)0x37432c);
                std::__cxx11::string::~string(local_5a8);
                std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
              }
              pmVar11 = std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                      *)in_stack_fffffffffffff710,
                                     &in_stack_fffffffffffff708->sequence);
              local_330 = *pmVar11;
              pmVar11 = std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                      *)in_stack_fffffffffffff710,
                                     &in_stack_fffffffffffff708->sequence);
              local_338 = *pmVar11;
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff710,(char *)in_stack_fffffffffffff708
                                     );
              if (bVar3) {
                local_330 = -local_330;
              }
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff710,(char *)in_stack_fffffffffffff708
                                     );
              if (bVar3) {
                local_338 = -local_338;
              }
              Support::Support(&local_5c0,Undefined,0,0);
              support.id = in_stack_fffffffffffff780;
              support.type = (char)in_stack_fffffffffffff778;
              support._1_1_ = (char)((ulong)in_stack_fffffffffffff778 >> 8);
              support.index = (short)((ulong)in_stack_fffffffffffff778 >> 0x10);
              support._4_4_ = (int)((ulong)in_stack_fffffffffffff778 >> 0x20);
              DistanceGraph::add_link
                        ((DistanceGraph *)
                         CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                         CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                         CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                         (int32_t)((ulong)in_stack_fffffffffffff758 >> 0x20),support);
              local_348 = local_348 + 1;
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff710,(char *)in_stack_fffffffffffff708
                                     );
              if (bVar3) {
                std::operator>>((istream *)local_4d0,local_318);
                std::operator>>((istream *)local_4d0,local_238);
                std::operator>>((istream *)local_4d0,local_278);
                std::istream::operator>>((istream *)local_4d0,&local_33c);
                pcVar9 = (char *)std::__cxx11::string::back();
                std::__cxx11::string::operator=(local_258,*pcVar9);
                std::__cxx11::string::pop_back();
                pcVar9 = (char *)std::__cxx11::string::back();
                std::__cxx11::string::operator=(local_298,*pcVar9);
                std::__cxx11::string::pop_back();
                local_5c8._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                             *)in_stack_fffffffffffff708,(key_type *)0x37462d);
                local_5d0._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                            *)in_stack_fffffffffffff708);
                bVar3 = std::__detail::operator==(&local_5c8,&local_5d0);
                if (bVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_628,"",&local_629);
                  Node::Node(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
                  sVar10 = add_node(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
                  pmVar11 = std::
                            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                          *)in_stack_fffffffffffff710,
                                         &in_stack_fffffffffffff708->sequence);
                  *pmVar11 = sVar10;
                  Node::~Node((Node *)0x374730);
                  std::__cxx11::string::~string(local_628);
                  std::allocator<char>::~allocator((allocator<char> *)&local_629);
                }
                local_638._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                             *)in_stack_fffffffffffff708,(key_type *)0x3747d4);
                local_640._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                            *)in_stack_fffffffffffff708);
                bVar3 = std::__detail::operator==(&local_638,&local_640);
                if (bVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_698,"",&local_699);
                  Node::Node(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
                  sVar10 = add_node(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
                  pmVar11 = std::
                            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                          *)in_stack_fffffffffffff710,
                                         &in_stack_fffffffffffff708->sequence);
                  *pmVar11 = sVar10;
                  Node::~Node((Node *)0x3748d7);
                  std::__cxx11::string::~string(local_698);
                  std::allocator<char>::~allocator((allocator<char> *)&local_699);
                }
                pmVar11 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                          ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                        *)in_stack_fffffffffffff710,
                                       &in_stack_fffffffffffff708->sequence);
                local_330 = *pmVar11;
                pmVar11 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                          ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                        *)in_stack_fffffffffffff710,
                                       &in_stack_fffffffffffff708->sequence);
                local_338 = *pmVar11;
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffff710,
                                        (char *)in_stack_fffffffffffff708);
                if (bVar3) {
                  local_330 = -local_330;
                }
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffff710,
                                        (char *)in_stack_fffffffffffff708);
                if (bVar3) {
                  local_338 = -local_338;
                }
                in_stack_fffffffffffff778 = local_330;
                in_stack_fffffffffffff780 = local_338;
                Support::Support(&local_6b0,Undefined,0,0);
                support_00.id = in_stack_fffffffffffff780;
                support_00.type = (char)in_stack_fffffffffffff778;
                support_00._1_1_ = (char)((ulong)in_stack_fffffffffffff778 >> 8);
                support_00.index = (short)((ulong)in_stack_fffffffffffff778 >> 0x10);
                support_00._4_4_ = (int)((ulong)in_stack_fffffffffffff778 >> 0x20);
                DistanceGraph::add_link
                          ((DistanceGraph *)
                           CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                           CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                           CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                           (int32_t)((ulong)in_stack_fffffffffffff758 >> 0x20),support_00);
                local_350 = local_350 + 1;
              }
            }
          }
          std::__cxx11::istringstream::~istringstream(local_4d0);
        }
        if ((float)local_348 * 0.5 < (float)local_350) {
          poVar4 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff738 >> 0x20),
                                     SUB81((ulong)in_stack_fffffffffffff738 >> 0x18,0));
          poVar4 = std::operator<<(poVar4,"Warning: The loaded graph contains ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_350);
          poVar4 = std::operator<<(poVar4," non-overlapping links out of ");
          in_stack_fffffffffffff738 = (void *)std::ostream::operator<<(poVar4,local_348);
          std::ostream::operator<<(in_stack_fffffffffffff738,std::endl<char,std::char_traits<char>>)
          ;
        }
        poVar4 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff738 >> 0x20),
                                   SUB81((ulong)in_stack_fffffffffffff738 >> 0x18,0));
        sVar7 = std::vector<Node,_std::allocator<Node>_>::size
                          ((vector<Node,_std::allocator<Node>_> *)(in_RDI + 0x40));
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar7 - 1);
        poVar4 = std::operator<<(poVar4," nodes after connecting with ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_348);
        poVar4 = std::operator<<(poVar4," links.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_318);
        std::__cxx11::string::~string(local_2f8);
        std::__cxx11::string::~string(local_2d8);
        std::__cxx11::string::~string(local_2b8);
        std::__cxx11::string::~string(local_298);
        std::__cxx11::string::~string(local_278);
        std::__cxx11::string::~string(local_258);
        std::__cxx11::string::~string(local_238);
        std::__cxx11::string::~string(local_218);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::~string(local_a0);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)0x374d5e);
        std::__cxx11::string::~string(local_38);
        return;
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_18,local_38);
      bVar2 = std::ios::eof();
      if (((bVar2 & 1) != 0) ||
         (pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar9 == '>'))
      break;
      std::__cxx11::string::operator+=(local_c0,local_38);
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      local_168._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   *)in_stack_fffffffffffff708,(key_type *)0x37373f);
      local_170._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)in_stack_fffffffffffff708);
      bVar3 = std::__detail::operator!=(&local_168,&local_170);
      if (bVar3) {
        local_1b1 = 1;
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
        std::operator+(in_stack_fffffffffffff718,(char *)in_stack_fffffffffffff710);
        std::logic_error::logic_error(this_00,local_190);
        local_1b1 = 0;
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      Node::Node(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
      sVar10 = add_node(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
      pmVar11 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                              *)in_stack_fffffffffffff710,&in_stack_fffffffffffff708->sequence);
      *pmVar11 = sVar10;
      Node::~Node((Node *)0x373a29);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff720,in_stack_fffffffffffff718);
      std::vector<Node,_std::allocator<Node>_>::back
                ((vector<Node,_std::allocator<Node>_> *)in_stack_fffffffffffff710);
      bVar3 = Node::is_canonical(in_stack_fffffffffffff728);
      if (!bVar3) {
        std::vector<Node,_std::allocator<Node>_>::back
                  ((vector<Node,_std::allocator<Node>_> *)in_stack_fffffffffffff710);
        Node::make_rc(in_stack_fffffffffffff790);
        pmVar11 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                *)in_stack_fffffffffffff710,&in_stack_fffffffffffff708->sequence);
        lVar1 = *pmVar11;
        pmVar11 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                *)in_stack_fffffffffffff710,&in_stack_fffffffffffff708->sequence);
        *pmVar11 = -lVar1;
        local_160 = local_160 + 1;
      }
    }
    std::__cxx11::string::clear();
    local_1f4 = 1;
    while( true ) {
      uVar5 = (ulong)local_1f4;
      uVar6 = std::__cxx11::string::size();
      bVar3 = false;
      if (uVar5 < uVar6) {
        pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        bVar3 = *pcVar9 != ' ';
      }
      if (!bVar3) break;
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      std::__cxx11::string::operator+=(local_a0,*pcVar9);
      local_1f4 = local_1f4 + 1;
    }
    std::__cxx11::string::operator=(local_c0,"");
  } while( true );
}

Assistant:

void SequenceDistanceGraph::load_from_gfa2(std::ifstream &gfaf, std::ifstream &fastaf) {
    std::string line;
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Graph fasta filename: " << fasta_filename << std::endl;
    //load all sequences from fasta file if they're not canonical, flip and remember they're flipped
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Loading sequences from " << fasta_filename << std::endl;

    std::unordered_map<std::string, unsigned int> gap_dist;
    std::string name, seq = "";
    seq.reserve(10000000); //stupid hack but probably useful to reserve
    oldnames_to_ids.clear();
    oldnames.push_back("");
    nodes.clear();
    links.clear();
    add_node(Node("",NodeStatus::Deleted)); //an empty deleted node on 0, just to skip the space
    sgNodeID_t nextid=1;
    uint64_t rcnodes=0;
    while(!fastaf.eof()){
        std::getline(fastaf,line);
        if (fastaf.eof() or line[0] == '>'){

            if (!name.empty()) {
                //rough ansi C and C++ mix but it works
                if (oldnames_to_ids.find(name) != oldnames_to_ids.end())
                    throw std::logic_error("sequence " + name + " is already defined");
                oldnames_to_ids[name] = add_node(Node(seq));
                oldnames.push_back(name);
                //reverse seq if not canonical
                if (!nodes.back().is_canonical()) {
                    nodes.back().make_rc();
                    oldnames_to_ids[name] = -oldnames_to_ids[name];
                    ++rcnodes;
                }
            }

            // Clear the name and set name to the new name, this is a new sequence!
            name.clear();
            for (auto i = 1; i < line.size() and line[i] != ' '; ++i) name += line[i];
            seq = "";
        } else {
            seq += line;

        }
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size()-1 << " nodes loaded (" << rcnodes << " canonised)." << std::endl;

    //load store all connections.

    std::string gfa_rtype,gfa_source,gfa_sourcedir,gfa_dest,gfa_destdir,gfa_cigar,gfa_star,gfa_length,id;
    unsigned int source_beg,source_end,dest_beg,dest_end;
    sgNodeID_t src_id,dest_id;
    int32_t dist;
    uint64_t lcount=0;
    uint64_t dist_egt0(0);
    while(std::getline(gfaf, line) and !gfaf.eof()) {
        std::istringstream iss(line);
        iss >> gfa_rtype;

        if (gfa_rtype == "S") {
            iss >> gfa_source;
            iss >> gfa_length;
            iss >> gfa_star;

            // The length of a sequence reported by GFA2 isn't required to match the actual length of the sequence
            /*
            if (oldnames_to_ids.find(gfa_source) != oldnames_to_ids.end()) {
                if (std::stoi(gfa_length.substr(5)) !=
                    nodes[std::abs(oldnames_to_ids[gfa_source])].sequence.length()) {
                    throw std::logic_error(
                            "Different length in node and fasta for sequence: " + gfa_source + " -> gfa:" +
                            gfa_length.substr(5) + ", fasta: " +
                            std::to_string(nodes[oldnames_to_ids[gfa_source]].sequence.length()));
                }
            }*/

        } else if (gfa_rtype == "E") {
            iss >> id;
            iss >> gfa_source;
            iss >> gfa_dest;
            iss >> source_beg;
            iss >> source_end;
            iss >> dest_beg;
            iss >> dest_end;
            iss >> gfa_cigar;

            dist =  -1 * (source_end - source_beg);
            gfa_sourcedir = gfa_source.back();
            gfa_source.pop_back();
            gfa_destdir = gfa_dest.back();
            gfa_dest.pop_back();

            //std::cout<<"'"<<source<<"' '"<<gfa_sourcedir<<"' '"<<dest<<"' '"<<destdir<<"'"<<std::endl;
            if (oldnames_to_ids.find(gfa_source) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_source] = add_node(Node(""));
                //std::cout<<"added source!" <<source<<std::endl;
            }
            if (oldnames_to_ids.find(gfa_dest) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_dest] = add_node(Node(""));
                //std::cout<<"added dest! "<<dest<<std::endl;
            }

            src_id=oldnames_to_ids[gfa_source];
            dest_id=oldnames_to_ids[gfa_dest];

            //Go from GFA's "Links as paths" to a normal "nodes have sinks (-/start/left) and sources (+/end/right)
            if (gfa_sourcedir == "+") src_id=-src_id;
            if (gfa_destdir == "-") dest_id=-dest_id;

            add_link(src_id,dest_id,dist);
            ++lcount;
        } else if (gfa_rtype == "G") {
            iss >> id;
            iss >> gfa_source;
            iss >> gfa_dest;
            iss >> dist;

            gfa_sourcedir = gfa_source.back();
            gfa_source.pop_back();
            gfa_destdir = gfa_dest.back();
            gfa_dest.pop_back();

            //std::cout<<"'"<<source<<"' '"<<gfa_sourcedir<<"' '"<<dest<<"' '"<<destdir<<"'"<<std::endl;
            if (oldnames_to_ids.find(gfa_source) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_source] = add_node(Node(""));
                //std::cout<<"added source!" <<source<<std::endl;
            }
            if (oldnames_to_ids.find(gfa_dest) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_dest] = add_node(Node(""));
                //std::cout<<"added dest! "<<dest<<std::endl;
            }

            src_id=oldnames_to_ids[gfa_source];
            dest_id=oldnames_to_ids[gfa_dest];

            //Go from GFA's "Links as paths" to a normal "nodes have sinks (-/start/left) and sources (+/end/right)
            if (gfa_sourcedir == "+") src_id=-src_id;
            if (gfa_destdir == "-") dest_id=-dest_id;

            add_link(src_id,dest_id,dist);

            dist_egt0++;
        }
    }
    if (dist_egt0 > lcount*0.5f) {
        sdglib::OutputLog(sdglib::LogLevels::WARN) << "Warning: The loaded graph contains " << dist_egt0 << " non-overlapping links out of " << lcount << std::endl;
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size() - 1 << " nodes after connecting with " << lcount << " links." << std::endl;

}